

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O1

void __thiscall
presolve::HighsPostsolveStack::equalityRowAddition<HighsTripletPositionSlice>
          (HighsPostsolveStack *this,HighsInt row,HighsInt addedEqRow,double eqRowScale,
          HighsMatrixSlice<HighsTripletPositionSlice> *eqRowVec)

{
  int iVar1;
  int iVar2;
  pointer pNVar3;
  pointer pcVar4;
  pointer piVar5;
  pointer pcVar6;
  pointer pcVar7;
  int iVar8;
  double *pdVar9;
  long lVar10;
  int *piVar11;
  size_t position;
  ReductionType local_59;
  HighsInt local_58;
  HighsInt local_54;
  vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
  *local_50;
  double local_48;
  double local_40;
  HighsInt *local_38;
  
  pNVar3 = (this->rowValues).
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->rowValues).
      super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
      ._M_impl.super__Vector_impl_data._M_finish != pNVar3) {
    (this->rowValues).
    super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
    ._M_impl.super__Vector_impl_data._M_finish = pNVar3;
  }
  local_50 = (vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
              *)&this->rowValues;
  iVar1 = eqRowVec->len;
  local_58 = row;
  local_54 = addedEqRow;
  local_40 = eqRowScale;
  if ((long)iVar1 != 0) {
    local_38 = eqRowVec->nodePositions;
    piVar11 = eqRowVec->nodeIndex;
    pdVar9 = eqRowVec->nodeValue;
    lVar10 = 0;
    iVar8 = 0;
    do {
      iVar2 = *(int *)((long)local_38 + lVar10);
      iVar8 = iVar2 - iVar8;
      piVar11 = piVar11 + iVar8;
      pdVar9 = pdVar9 + iVar8;
      local_48 = *pdVar9;
      std::
      vector<presolve::HighsPostsolveStack::Nonzero,std::allocator<presolve::HighsPostsolveStack::Nonzero>>
      ::emplace_back<int&,double>
                (local_50,(this->origColIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl
                          .super__Vector_impl_data._M_start + *piVar11,&local_48);
      lVar10 = lVar10 + 4;
      iVar8 = iVar2;
    } while ((long)iVar1 * 4 != lVar10);
  }
  pcVar4 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  piVar5 = (this->origRowIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar1 = piVar5[local_58];
  iVar8 = piVar5[local_54];
  pcVar6 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<char,_std::allocator<char>_>::resize
            (&(this->reductionValues).data,(size_type)(pcVar4 + (0x10 - (long)pcVar6)));
  pcVar7 = (this->reductionValues).data.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  *(int *)(pcVar4 + ((long)pcVar7 - (long)pcVar6)) = iVar1;
  *(int *)(pcVar4 + (long)(pcVar7 + (4 - (long)pcVar6))) = iVar8;
  *(double *)(pcVar4 + (long)(pcVar7 + (8 - (long)pcVar6))) = local_40;
  HighsDataStack::push<presolve::HighsPostsolveStack::Nonzero>
            (&this->reductionValues,
             (vector<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
              *)local_50);
  local_59 = kEqualityRowAddition;
  local_48 = (double)((long)(this->reductionValues).data.
                            super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(this->reductionValues).data.
                           super__Vector_base<char,_std::allocator<char>_>._M_impl.
                           super__Vector_impl_data._M_start);
  std::
  vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
  ::emplace_back<presolve::HighsPostsolveStack::ReductionType&,unsigned_long&>
            ((vector<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>,std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,unsigned_long>>>
              *)&this->reductions,&local_59,(unsigned_long *)&local_48);
  return;
}

Assistant:

void equalityRowAddition(HighsInt row, HighsInt addedEqRow, double eqRowScale,
                           const HighsMatrixSlice<RowStorageFormat>& eqRowVec) {
    rowValues.clear();
    for (const HighsSliceNonzero& rowVal : eqRowVec)
      rowValues.emplace_back(origColIndex[rowVal.index()], rowVal.value());

    reductionValues.push(EqualityRowAddition{
        origRowIndex[row], origRowIndex[addedEqRow], eqRowScale});
    reductionValues.push(rowValues);
    reductionAdded(ReductionType::kEqualityRowAddition);
  }